

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.h
# Opt level: O2

void __thiscall
RigidBodyDynamics::Constraint::addInBaumgarteStabilizationForces
          (Constraint *this,VectorNd *errPosSys,VectorNd *errVelSys,VectorNd *gammaSysOutput)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  uint i;
  ulong uVar7;
  uint uVar8;
  
  uVar2 = this->sizeOfConstraint;
  uVar3 = this->rowInSystem;
  pdVar4 = (errVelSys->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  pdVar5 = (errPosSys->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  pdVar6 = (gammaSysOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_data;
  for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 1) {
    dVar1 = (this->baumgarteParameters).super_Vector2d.
            super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1];
    uVar8 = uVar3 + (int)uVar7;
    pdVar6[uVar8] =
         ((this->baumgarteParameters).super_Vector2d.
          super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] *
          -2.0 * pdVar4[uVar8] - dVar1 * dVar1 * pdVar5[uVar8]) + pdVar6[uVar8];
  }
  return;
}

Assistant:

void addInBaumgarteStabilizationForces(const Math::VectorNd &errPosSys,
                                           const Math::VectorNd &errVelSys,
                                           Math::VectorNd &gammaSysOutput)
    {

      //Here a for loop is used rather than a block operation
      //to be compatible with SimpleMath.
      for(unsigned int i=0; i<sizeOfConstraint;++i){
        gammaSysOutput[rowInSystem+i] +=
              -2.*baumgarteParameters[0]*errVelSys[rowInSystem+i]
             -(baumgarteParameters[1]*baumgarteParameters[1]
              )*errPosSys[rowInSystem+i];
      }
    }